

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_CreateFromStream
          (ktxStream *pStream,ktxTextureCreateFlags createFlags,ktxTexture1 **newTex)

{
  void *__ptr;
  undefined8 *in_RDX;
  ktxTexture1 *tex;
  ktxStream *in_stack_00000010;
  ktx_error_code_e result;
  undefined4 local_4;
  
  if (in_RDX == (undefined8 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    __ptr = malloc(0x90);
    if (__ptr == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      local_4 = ktxTexture1_constructFromStream((ktxTexture1 *)newTex,in_stack_00000010,tex._4_4_);
      if (local_4 == KTX_SUCCESS) {
        *in_RDX = __ptr;
      }
      else {
        free(__ptr);
        *in_RDX = 0;
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture1_CreateFromStream(ktxStream* pStream,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture1** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture1* tex = (ktxTexture1*)malloc(sizeof(ktxTexture1));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture1_constructFromStream(tex, pStream, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture1*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}